

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::TypedConfigurations::setValue<el::base::LogFormat>
          (TypedConfigurations *this,Level level,LogFormat *value,
          unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
          *confMap,bool includeGlobalLevel)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *this_00;
  Level local_dc;
  key_type local_d8 [2];
  LogFormat local_d0;
  
  local_dc = level;
  if ((confMap->_M_h)._M_element_count == 0 && includeGlobalLevel) {
    local_d8[0] = Global;
    LogFormat::LogFormat(&local_d0,value);
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,el::base::LogFormat>,std::allocator<std::pair<el::Level_const,el::base::LogFormat>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,el::base::LogFormat>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,el::base::LogFormat>,std::allocator<std::pair<el::Level_const,el::base::LogFormat>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)confMap,local_d8);
  }
  else {
    local_d8[0] = Global;
    iVar2 = utils::std::
            _Hashtable<el::Level,_std::pair<const_el::Level,_el::base::LogFormat>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&confMap->_M_h,local_d8);
    if ((iVar2.super__Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true>.
         _M_cur != (__node_type *)0x0) &&
       (bVar1 = LogFormat::operator==
                          ((LogFormat *)
                           ((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true>
                                  ._M_cur + 0x10),value), bVar1)) {
      return;
    }
    iVar2 = utils::std::
            _Hashtable<el::Level,_std::pair<const_el::Level,_el::base::LogFormat>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&confMap->_M_h,&local_dc);
    if (iVar2.super__Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true>.
        _M_cur != (__node_type *)0x0) {
      this_00 = utils::std::__detail::
                _Map_base<el::Level,_std::pair<const_el::Level,_el::base::LogFormat>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<el::Level,_std::pair<const_el::Level,_el::base::LogFormat>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)confMap,&local_dc);
      LogFormat::operator=(this_00,value);
      return;
    }
    local_d8[0] = local_dc;
    LogFormat::LogFormat(&local_d0,value);
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,el::base::LogFormat>,std::allocator<std::pair<el::Level_const,el::base::LogFormat>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,el::base::LogFormat>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,el::base::LogFormat>,std::allocator<std::pair<el::Level_const,el::base::LogFormat>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)confMap,local_d8);
  }
  LogFormat::~LogFormat(&local_d0);
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::unordered_map<Level, Conf_T>* confMap,
                bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }